

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  SourceRange referencingRange;
  string_view definitionName;
  ClassType *pCVar1;
  GenericClassDefSymbol *startLoc;
  bool bVar2;
  SymbolIndex index;
  int iVar3;
  SourceLocation SVar4;
  Scope *scope_00;
  TypeParameterSymbol *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*> *ppVar6;
  SyntaxNode *this_00;
  ClassDeclarationSyntax *syntax_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  templated_iterator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>
  local_388;
  templated_iterator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>
  local_380;
  iterator it;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> local_368;
  span<const_slang::ConstantValue_*,_18446744073709551615UL> local_358;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> local_348;
  undefined1 local_338 [8];
  SpecializationKey key;
  TypeParameterSymbol *tps;
  ConstantValue *local_2e8;
  ParameterSymbol *local_2e0;
  ParameterSymbol *ps;
  Symbol *sym;
  GenericClassDefSymbol *local_2c8;
  ParameterSymbolBase *local_2c0;
  ParameterSymbolBase *param;
  ParameterDecl *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<slang::ast::Definition::ParameterDecl,_8UL> *__range2;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  undefined1 auStack_208 [8];
  SourceRange instRange;
  span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> local_1e8;
  size_t local_1d8;
  char *pcStack_1d0;
  undefined1 local_1c8 [8];
  ParameterBuilder paramBuilder;
  SourceLocation SStack_50;
  bool isForDefault;
  ClassType *classType;
  Scope *scope;
  Compilation *comp;
  ParameterValueAssignmentSyntax *syntax_local;
  ASTContext *pAStack_28;
  bool forceInvalidParams_local;
  ASTContext *context_local;
  GenericClassDefSymbol *this_local;
  SourceLocation instanceLoc_local;
  
  comp = (Compilation *)syntax;
  syntax_local._7_1_ = forceInvalidParams;
  pAStack_28 = context;
  context_local = (ASTContext *)this;
  this_local = (GenericClassDefSymbol *)instanceLoc;
  scope = (Scope *)ASTContext::getCompilation(context);
  classType = (ClassType *)Symbol::getParentScope(&this->super_Symbol);
  if (classType == (ClassType *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
               ,0x307,
               "const Type *slang::ast::GenericClassDefSymbol::getSpecializationImpl(const ASTContext &, SourceLocation, bool, const ParameterValueAssignmentSyntax *) const"
              );
  }
  SVar4 = (SourceLocation)
          BumpAllocator::
          emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                    ((BumpAllocator *)scope,(Compilation *)scope,&(this->super_Symbol).name,
                     &(this->super_Symbol).location);
  pCVar1 = classType;
  *(GenericClassDefSymbol **)((long)SVar4 + 0x78) = this;
  SStack_50 = SVar4;
  index = Symbol::getIndex(&this->super_Symbol);
  Symbol::setParent((Symbol *)SVar4,(Scope *)pCVar1,index);
  paramBuilder._367_1_ = comp == (Compilation *)0x0;
  scope_00 = not_null<const_slang::ast::Scope_*>::operator*(&pAStack_28->scope);
  local_1d8 = (this->super_Symbol).name._M_len;
  pcStack_1d0 = (this->super_Symbol).name._M_str;
  nonstd::span_lite::span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL>::
  span<slang::SmallVector<slang::ast::Definition::ParameterDecl,_8UL>,_0>
            (&local_1e8,&this->paramDecls);
  definitionName._M_str = pcStack_1d0;
  definitionName._M_len = local_1d8;
  ParameterBuilder::ParameterBuilder
            ((ParameterBuilder *)local_1c8,scope_00,definitionName,local_1e8);
  ParameterBuilder::setForceInvalidValues
            ((ParameterBuilder *)local_1c8,(bool)(syntax_local._7_1_ & 1));
  ParameterBuilder::setSuppressErrors
            ((ParameterBuilder *)local_1c8,(bool)(paramBuilder._367_1_ & 1));
  ParameterBuilder::setInstanceContext((ParameterBuilder *)local_1c8,pAStack_28);
  if (comp != (Compilation *)0x0) {
    ParameterBuilder::setAssignments
              ((ParameterBuilder *)local_1c8,(ParameterValueAssignmentSyntax *)comp);
  }
  startLoc = this_local;
  SVar4 = SourceLocation::operator+((SourceLocation *)&this_local,1);
  SourceRange::SourceRange((SourceRange *)auStack_208,(SourceLocation)startLoc,SVar4);
  SmallVector<const_slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ConstantValue_*,_5UL> *)(typeParams.stackBase + 0x18));
  SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)&__range2);
  __begin2 = (const_iterator)&this->paramDecls;
  __end2 = SmallVectorBase<slang::ast::Definition::ParameterDecl>::begin
                     ((SmallVectorBase<slang::ast::Definition::ParameterDecl> *)__begin2);
  decl = SmallVectorBase<slang::ast::Definition::ParameterDecl>::end
                   ((SmallVectorBase<slang::ast::Definition::ParameterDecl> *)__begin2);
  src = extraout_RDX;
  do {
    if (__end2 == decl) {
      iVar3 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                        ((SmallVectorBase<const_slang::ConstantValue_*> *)
                         (typeParams.stackBase + 0x18),(EVP_PKEY_CTX *)scope,src);
      local_358.data_ = (pointer)CONCAT44(extraout_var,iVar3);
      nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::
      span<const_slang::ConstantValue_*,_18446744073709551615UL,_0>(&local_348,&local_358);
      iVar3 = SmallVectorBase<const_slang::ast::Type_*>::copy
                        ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2,
                         (EVP_PKEY_CTX *)scope,src_00);
      it.current = (EntryPointer)CONCAT44(extraout_var_00,iVar3);
      nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::
      span<const_slang::ast::Type_*,_18446744073709551615UL,_0>
                (&local_368,(span<const_slang::ast::Type_*,_18446744073709551615UL> *)&it);
      SpecializationKey::SpecializationKey((SpecializationKey *)local_338,this,local_348,local_368);
      local_380.current =
           (EntryPointer)
           ska::detailv3::
           sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
           ::find(&(this->specMap).
                   super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                  ,(SpecializationKey *)local_338);
      local_388.current =
           (EntryPointer)
           ska::detailv3::
           sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
           ::end(&(this->specMap).
                  super_sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                );
      bVar2 = ska::detailv3::operator!=(&local_380,&local_388);
      if (bVar2) {
        ppVar6 = ska::detailv3::
                 sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::SpecializationKey,_slang::ast::GenericClassDefSymbol::Hasher,_ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_slang::ast::GenericClassDefSymbol::Hasher>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,_ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,_std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>,_std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>_>,_std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>_>_>
                 ::
                 templated_iterator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,_const_slang::ast::Type_*>_>
                 ::operator->(&local_380);
        instanceLoc_local = (SourceLocation)ppVar6->second;
      }
      else {
        bVar2 = function_ref::operator_cast_to_bool((function_ref *)&this->specializeFunc);
        pCVar1 = classType;
        SVar4 = SStack_50;
        if (bVar2) {
          function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&)>::operator()
                    (&this->specializeFunc,(Compilation *)scope,(ClassType *)SStack_50);
        }
        else {
          this_00 = Symbol::getSyntax(&this->super_Symbol);
          syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>(this_00);
          ClassType::populate((ClassType *)SVar4,(Scope *)pCVar1,syntax_00);
        }
        ska::detailv3::
        sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
        ::emplace<slang::ast::GenericClassDefSymbol::SpecializationKey&,slang::ast::ClassType*&>
                  ((sherwood_v3_table<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::GenericClassDefSymbol::Hasher,ska::detailv3::KeyOrValueHasher<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,slang::ast::GenericClassDefSymbol::Hasher>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>,ska::detailv3::KeyOrValueEquality<slang::ast::GenericClassDefSymbol::SpecializationKey,std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>,std::equal_to<slang::ast::GenericClassDefSymbol::SpecializationKey>>,std::allocator<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::GenericClassDefSymbol::SpecializationKey,slang::ast::Type_const*>>>>
                    *)&this->specMap,(SpecializationKey *)local_338,
                   (ClassType **)&stack0xffffffffffffffb0);
        instanceLoc_local = SStack_50;
      }
LAB_006ad945:
      sym._4_4_ = 1;
      SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Type_*,_5UL> *)&__range2);
      SmallVector<const_slang::ConstantValue_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ConstantValue_*,_5UL> *)(typeParams.stackBase + 0x18));
      ParameterBuilder::~ParameterBuilder((ParameterBuilder *)local_1c8);
      return (Type *)instanceLoc_local;
    }
    param = (ParameterSymbolBase *)__end2;
    local_2c8 = this_local;
    local_2c0 = ParameterBuilder::createParam
                          ((ParameterBuilder *)local_1c8,__end2,(Scope *)((long)SStack_50 + 0x48),
                           (SourceLocation)this_local);
    bVar2 = ParameterBuilder::hasErrors((ParameterBuilder *)local_1c8);
    if (bVar2) {
      if ((paramBuilder._367_1_ & 1) == 0) {
        instanceLoc_local = (SourceLocation)Compilation::getErrorType((Compilation *)scope);
      }
      else {
        instanceLoc_local = (SourceLocation)0x0;
      }
      goto LAB_006ad945;
    }
    bVar2 = ParameterSymbolBase::isLocalParam(local_2c0);
    src = extraout_RDX_00;
    if (!bVar2) {
      ps = (ParameterSymbol *)local_2c0->symbol;
      if ((ps->super_ValueSymbol).super_Symbol.kind == Parameter) {
        local_2e0 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)ps);
        referencingRange.endLoc = instRange.startLoc;
        referencingRange.startLoc = (SourceLocation)auStack_208;
        local_2e8 = ParameterSymbol::getValue(local_2e0,referencingRange);
        SmallVectorBase<const_slang::ConstantValue_*>::push_back
                  ((SmallVectorBase<const_slang::ConstantValue_*> *)(typeParams.stackBase + 0x18),
                   &local_2e8);
        src = extraout_RDX_01;
      }
      else {
        pTVar5 = Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)ps);
        key.savedHash = (size_t)DeclaredType::getType(&pTVar5->targetType);
        SmallVectorBase<const_slang::ast::Type_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2,(Type **)&key.savedHash);
        src = extraout_RDX_02;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    ASSERT(scope);

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    SpecializationKey key(*this, paramValues.copy(comp), typeParams.copy(comp));
    if (auto it = specMap.find(key); it != specMap.end())
        return it->second;

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());
    specMap.emplace(key, classType);
    return classType;
}